

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86.cpp
# Opt level: O1

int __thiscall ncnn::LRN_x86::forward_inplace(LRN_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _c;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  int *piVar6;
  pointer piVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  void *pvVar11;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  void *pvVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  void *pvVar26;
  int iVar27;
  float fVar28;
  allocator_type local_169;
  ulong local_168;
  ulong local_160;
  Mat square_sum;
  ulong local_108;
  Mat square_blob;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  uVar10 = bottom_top_blob->w;
  local_168 = (ulong)(uint)bottom_top_blob->h;
  _c = bottom_top_blob->c;
  uVar18 = (ulong)_c;
  sVar2 = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (void *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize._0_4_ = 0;
  square_blob.elemsize._4_4_ = 0;
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)0x0;
  square_blob.dims = 0;
  square_blob.w = 0;
  square_blob.h = 0;
  square_blob.d = 0;
  square_blob.c = 0;
  Mat::create(&square_blob,uVar10,bottom_top_blob->h,_c,sVar2,opt->workspace_allocator);
  iVar27 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_0020d2cf;
  iVar9 = (int)local_168 * uVar10;
  if (0 < (int)_c) {
    pvVar11 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->cstep;
    sVar4 = bottom_top_blob->elemsize;
    uVar24 = 0;
    pvVar16 = square_blob.data;
    do {
      if (0 < iVar9) {
        lVar25 = 0;
        do {
          fVar1 = *(float *)((long)pvVar11 + lVar25 * 4);
          *(float *)((long)pvVar16 + lVar25 * 4) = fVar1 * fVar1;
          lVar25 = lVar25 + 1;
        } while (iVar9 != (int)lVar25);
      }
      uVar24 = uVar24 + 1;
      pvVar11 = (void *)((long)pvVar11 + sVar3 * sVar4);
      pvVar16 = (void *)((long)pvVar16 +
                        square_blob.cstep *
                        CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize));
    } while (uVar24 != uVar18);
  }
  if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,uVar10,(int)local_168,_c,sVar2,opt->workspace_allocator);
    bVar8 = square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0;
    if (bVar8) {
      piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (square_sum.allocator == (Allocator *)0x0) {
            if (square_sum.data != (void *)0x0) {
              free(square_sum.data);
            }
          }
          else {
            (*(square_sum.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      goto LAB_0020d2cf;
    }
    local_168 = CONCAT71(local_168._1_7_,bVar8);
    if (0 < square_sum.c * (int)square_sum.cstep) {
      memset(square_sum.data,0,(ulong)(uint)(square_sum.c * (int)square_sum.cstep) << 2);
    }
    if (0 < (int)_c) {
      pp_Var5 = this->_vptr_LRN_x86;
      fVar1 = *(float *)(&this->field_0xd8 + (long)pp_Var5[-3]);
      iVar27 = *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      pvVar11 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      local_160 = square_sum.cstep *
                  CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      sVar3 = bottom_top_blob->elemsize;
      uVar24 = 0;
      pvVar16 = square_sum.data;
      do {
        iVar12 = *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) / 2;
        iVar15 = (int)uVar24;
        uVar10 = iVar15 - iVar12;
        if ((int)uVar10 <= iVar12 + iVar15) {
          lVar25 = square_sum.cstep *
                   CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize) * uVar24;
          do {
            if (uVar10 < _c && 0 < iVar9) {
              lVar17 = 0;
              do {
                *(float *)((long)square_sum.data + lVar17 * 4 + lVar25) =
                     *(float *)((long)square_sum.data + lVar17 * 4 + lVar25) +
                     *(float *)((long)square_blob.data +
                               lVar17 * 4 +
                               square_blob.cstep *
                               CONCAT44(square_blob.elemsize._4_4_,(undefined4)square_blob.elemsize)
                               * (ulong)uVar10);
                lVar17 = lVar17 + 1;
              } while (iVar9 != (int)lVar17);
            }
            bVar8 = (int)uVar10 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]) / 2 + iVar15;
            uVar10 = uVar10 + 1;
          } while (bVar8);
        }
        if (0 < iVar9) {
          lVar25 = 0;
          do {
            fVar28 = powf(*(float *)((long)pvVar16 + lVar25 * 4) * fVar1 * (1.0 / (float)iVar27) +
                          *(float *)(&this->field_0xe0 + (long)pp_Var5[-3]),
                          -*(float *)(&this->field_0xdc + (long)pp_Var5[-3]));
            *(float *)((long)pvVar11 + lVar25 * 4) = fVar28 * *(float *)((long)pvVar11 + lVar25 * 4)
            ;
            lVar25 = lVar25 + 1;
          } while (iVar9 != (int)lVar25);
        }
        uVar24 = uVar24 + 1;
        pvVar16 = (void *)((long)pvVar16 + local_160);
        pvVar11 = (void *)((long)pvVar11 + sVar2 * sVar3);
      } while (uVar24 != uVar18);
    }
    piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
    iVar27 = -100;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if ((char)local_168 != '\0') goto LAB_0020d2cf;
  }
  else if (*(int *)(&this->field_0xd0 + (long)this->_vptr_LRN_x86[-3]) == 1) {
    piVar6 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = square_blob.refcount._0_4_;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = square_blob.elemsize._4_4_;
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + 1;
      UNLOCK();
    }
    uVar14 = uVar10;
    if (1 < (int)*(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3])) {
      uVar14 = *(uint *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]) >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      iVar9 = ~uVar14 + *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
      copy_make_border(&square_blob,&square_sum,uVar14,iVar9,uVar14,iVar9,0,0.0,
                       (Option *)&_space_ofs);
      uVar14 = square_sum.w;
      if (square_sum.data == (void *)0x0 || (long)square_sum.c * square_sum.cstep == 0) {
        piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (square_sum.allocator == (Allocator *)0x0) {
              if (square_sum.data != (void *)0x0) {
                free(square_sum.data);
              }
            }
            else {
              (*(square_sum.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        square_sum.cstep = 0;
        square_sum.data = (void *)0x0;
        square_sum.refcount._0_4_ = 0;
        square_sum.refcount._4_4_ = 0;
        square_sum.elemsize._0_4_ = 0;
        square_sum.elemsize._4_4_ = 0;
        square_sum.elempack = 0;
        square_sum.dims = 0;
        square_sum.w = 0;
        square_sum.h = 0;
        square_sum.d = 0;
        square_sum.c = 0;
        goto LAB_0020d2cf;
      }
    }
    iVar27 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86[-3]);
    uVar20 = iVar27 * iVar27;
    fVar1 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86[-3]);
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar20,&local_169);
    piVar7 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pvVar11 = square_sum.data;
    pp_Var5 = this->_vptr_LRN_x86;
    iVar9 = *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]);
    if (0 < iVar9) {
      iVar12 = 0;
      iVar15 = 0;
      iVar21 = 0;
      do {
        if (0 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3])) {
          lVar25 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar21 + lVar25] = iVar15 + (int)lVar25;
            lVar25 = lVar25 + 1;
            iVar23 = (int)lVar25;
          } while (iVar23 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
          iVar21 = iVar21 + iVar23;
          iVar15 = iVar15 + iVar23;
        }
        iVar15 = iVar15 + (uVar14 - iVar9);
        iVar12 = iVar12 + 1;
      } while (iVar12 < *(int *)(&this->field_0xd4 + (long)pp_Var5[-3]));
    }
    if (0 < (int)_c) {
      pvVar16 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      lVar17 = (long)square_sum.w;
      lVar25 = CONCAT44(square_sum.elemsize._4_4_,(undefined4)square_sum.elemsize);
      lVar22 = square_sum.cstep * lVar25;
      sVar3 = bottom_top_blob->elemsize;
      local_108 = 0;
      do {
        if (0 < (int)local_168) {
          pvVar26 = (void *)(sVar2 * sVar3 * local_108 + (long)pvVar16);
          pp_Var5 = this->_vptr_LRN_x86;
          local_160 = 0;
          do {
            if (0 < (int)uVar10) {
              lVar19 = lVar17 * lVar25 * local_160;
              uVar24 = 0;
              do {
                if (iVar27 == 0) {
                  fVar28 = 0.0;
                }
                else {
                  fVar28 = 0.0;
                  uVar13 = 0;
                  do {
                    fVar28 = fVar28 + *(float *)((long)pvVar11 +
                                                (long)piVar7[uVar13] * 4 +
                                                uVar24 * 4 + lVar19 + lVar22 * local_108);
                    uVar13 = uVar13 + 1;
                  } while (uVar20 + (uVar20 == 0) != uVar13);
                }
                fVar28 = powf(fVar28 * fVar1 * (1.0 / (float)(int)uVar20) +
                              *(float *)(&this->field_0xe0 + (long)pp_Var5[-3]),
                              -*(float *)(&this->field_0xdc + (long)pp_Var5[-3]));
                *(float *)((long)pvVar26 + uVar24 * 4) =
                     fVar28 * *(float *)((long)pvVar26 + uVar24 * 4);
                uVar24 = uVar24 + 1;
              } while (uVar24 != uVar10);
            }
            pvVar26 = (void *)((long)pvVar26 + (long)(int)uVar10 * 4);
            local_160 = local_160 + 1;
          } while (local_160 != local_168);
        }
        local_108 = local_108 + 1;
      } while (local_108 != uVar18);
    }
    if (_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    piVar6 = (int *)CONCAT44(square_sum.refcount._4_4_,square_sum.refcount._0_4_);
    if (piVar6 != (int *)0x0) {
      LOCK();
      *piVar6 = *piVar6 + -1;
      UNLOCK();
      if (*piVar6 == 0) {
        if (square_sum.allocator == (Allocator *)0x0) {
          if (square_sum.data != (void *)0x0) {
            free(square_sum.data);
          }
        }
        else {
          (*(square_sum.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
  }
  iVar27 = 0;
LAB_0020d2cf:
  piVar6 = (int *)CONCAT44(square_blob.refcount._4_4_,square_blob.refcount._0_4_);
  if (piVar6 != (int *)0x0) {
    LOCK();
    *piVar6 = *piVar6 + -1;
    UNLOCK();
    if (*piVar6 == 0) {
      if (square_blob.allocator == (Allocator *)0x0) {
        if (square_blob.data != (void *)0x0) {
          free(square_blob.data);
        }
      }
      else {
        (*(square_blob.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar27;
}

Assistant:

int LRN_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}